

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::strings_internal::AppendPieces
          (strings_internal *this,Nonnull<std::string_*> dest,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces)

{
  bool bVar1;
  long lVar2;
  size_type sVar3;
  const_pointer pvVar4;
  long lVar5;
  ulong uVar6;
  size_t this_size;
  string_view piece_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range2_1;
  char *out;
  char *begin;
  string_view piece;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *__range2;
  size_t to_append;
  size_t old_size;
  Nonnull<std::string_*> dest_local;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_local;
  
  pieces_local._M_array = pieces._M_array;
  dest_local = dest;
  lVar2 = std::__cxx11::string::size();
  __range2 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x0;
  __end2 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                     ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                      &dest_local);
  piece._M_str = (char *)std::
                         initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::
                         end((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>
                              *)&dest_local);
  for (; __end2 != (const_iterator)piece._M_str; __end2 = __end2 + 1) {
    begin = (char *)__end2->_M_len;
    piece._M_len = (size_t)__end2->_M_str;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&begin);
    bVar1 = true;
    if (sVar3 != 0) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&begin);
      lVar5 = std::__cxx11::string::data();
      uVar6 = std::__cxx11::string::size();
      bVar1 = uVar6 < (ulong)((long)pvVar4 - lVar5);
    }
    if (!bVar1) {
      __assert_fail("((piece).size() == 0) || (uintptr_t((piece).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                    ,0xa7,
                    "void absl::strings_internal::AppendPieces(absl::Nonnull<std::string *>, std::initializer_list<absl::string_view>)"
                   );
    }
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&begin);
    __range2 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               ((long)&__range2->_M_array + sVar3);
  }
  anon_unknown_5::STLStringAppendUninitializedAmortized((string *)this,(size_t)__range2);
  lVar5 = std::__cxx11::string::operator[]((ulong)this);
  __range2_1 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               (lVar5 + lVar2);
  __end2_1 = std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::begin
                       ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                        &dest_local);
  piece_1._M_str =
       (char *)std::initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>::end
                         ((initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_>
                           *)&dest_local);
  for (; __end2_1 != (const_iterator)piece_1._M_str; __end2_1 = __end2_1 + 1) {
    this_size = __end2_1->_M_len;
    piece_1._M_len = (size_t)__end2_1->_M_str;
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_size);
    if (sVar3 != 0) {
      pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)&this_size);
      memcpy(__range2_1,pvVar4,sVar3);
      __range2_1 = (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                   ((long)&__range2_1->_M_array + sVar3);
    }
  }
  lVar2 = std::__cxx11::string::size();
  if (__range2_1 ==
      (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)(lVar5 + lVar2)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/str_cat.cc"
                ,0xb5,
                "void absl::strings_internal::AppendPieces(absl::Nonnull<std::string *>, std::initializer_list<absl::string_view>)"
               );
}

Assistant:

void AppendPieces(absl::Nonnull<std::string*> dest,
                  std::initializer_list<absl::string_view> pieces) {
  size_t old_size = dest->size();
  size_t to_append = 0;
  for (absl::string_view piece : pieces) {
    ASSERT_NO_OVERLAP(*dest, piece);
    to_append += piece.size();
  }
  STLStringAppendUninitializedAmortized(dest, to_append);

  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  for (absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    if (this_size != 0) {
      memcpy(out, piece.data(), this_size);
      out += this_size;
    }
  }
  assert(out == begin + dest->size());
}